

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O2

void blend_a64_vmask_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  long lVar1;
  undefined1 in_XMM0 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 in_XMM4 [16];
  short sVar11;
  undefined1 in_XMM5 [16];
  undefined1 auVar12 [16];
  
  lVar1 = 0;
  auVar2 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    auVar3 = pshuflw(ZEXT116(mask[lVar1]),ZEXT116(mask[lVar1]),0);
    sVar10 = auVar3._0_2_;
    sVar11 = auVar3._2_2_;
    auVar3 = pmovzxbw(in_XMM4,*(undefined8 *)src0);
    auVar12 = pmovzxbw(in_XMM5,*(undefined8 *)src1);
    in_XMM5._0_2_ = auVar12._0_2_ * (auVar2._0_2_ - sVar10);
    in_XMM5._2_2_ = auVar12._2_2_ * (auVar2._2_2_ - sVar11);
    in_XMM5._4_2_ = auVar12._4_2_ * (auVar2._4_2_ - sVar10);
    in_XMM5._6_2_ = auVar12._6_2_ * (auVar2._6_2_ - sVar11);
    in_XMM5._8_2_ = auVar12._8_2_ * (auVar2._8_2_ - sVar10);
    in_XMM5._10_2_ = auVar12._10_2_ * (auVar2._10_2_ - sVar11);
    in_XMM5._12_2_ = auVar12._12_2_ * (auVar2._12_2_ - sVar10);
    in_XMM5._14_2_ = auVar12._14_2_ * (auVar2._14_2_ - sVar11);
    sVar4 = pavgw((ushort)(auVar3._0_2_ * sVar10 + in_XMM5._0_2_) >> 5,0);
    sVar5 = pavgw((ushort)(auVar3._2_2_ * sVar11 + in_XMM5._2_2_) >> 5,0);
    sVar6 = pavgw((ushort)(auVar3._4_2_ * sVar10 + in_XMM5._4_2_) >> 5,0);
    sVar7 = pavgw((ushort)(auVar3._6_2_ * sVar11 + in_XMM5._6_2_) >> 5,0);
    sVar8 = pavgw((ushort)(auVar3._8_2_ * sVar10 + in_XMM5._8_2_) >> 5,0);
    sVar9 = pavgw((ushort)(auVar3._10_2_ * sVar11 + in_XMM5._10_2_) >> 5,0);
    sVar10 = pavgw((ushort)(auVar3._12_2_ * sVar10 + in_XMM5._12_2_) >> 5,0);
    sVar11 = pavgw((ushort)(auVar3._14_2_ * sVar11 + in_XMM5._14_2_) >> 5,0);
    in_XMM4._0_8_ =
         CONCAT17((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11),
                  CONCAT16((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10),
                           CONCAT15((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9),
                                    CONCAT14((0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 -
                                             (0xff < sVar8),
                                             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 -
                                                      (0xff < sVar7),
                                                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                               (char)sVar6 - (0xff < sVar6),
                                                               CONCAT11((0 < sVar5) *
                                                                        (sVar5 < 0x100) *
                                                                        (char)sVar5 - (0xff < sVar5)
                                                                        ,(0 < sVar4) *
                                                                         (sVar4 < 0x100) *
                                                                         (char)sVar4 -
                                                                         (0xff < sVar4))))))));
    in_XMM4[8] = (0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 - (0xff < sVar4);
    in_XMM4[9] = (0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 - (0xff < sVar5);
    in_XMM4[10] = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
    in_XMM4[0xb] = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
    in_XMM4[0xc] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
    in_XMM4[0xd] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    in_XMM4[0xe] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    in_XMM4[0xf] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    *(undefined8 *)dst = in_XMM4._0_8_;
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    lVar1 = lVar1 + 1;
  } while (h != (int)lVar1);
  return;
}

Assistant:

static void blend_a64_vmask_w8_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                      const uint8_t *src0, uint32_t src0_stride,
                                      const uint8_t *src1, uint32_t src1_stride,
                                      const uint8_t *mask, int w, int h) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  (void)w;

  do {
    const __m128i v_m0_w = _mm_set1_epi16(*mask);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

    const __m128i v_res_w = blend_8(src0, src1, &v_m0_w, &v_m1_w);

    const __m128i v_res_b = _mm_packus_epi16(v_res_w, v_res_w);

    xx_storel_64(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 1;
  } while (--h);
}